

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void testing::internal::ShuffleRange<int>
               (Random *random,int begin,int end,vector<int,_std::allocator<int>_> *v)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  UInt32 UVar4;
  size_type sVar5;
  ostream *poVar6;
  reference __a;
  reference __b;
  bool local_79;
  bool local_45;
  int selected;
  int last_in_range;
  int range_width;
  GTestLog local_28;
  int local_24;
  vector<int,_std::allocator<int>_> *pvStack_20;
  int size;
  vector<int,_std::allocator<int>_> *v_local;
  int end_local;
  int begin_local;
  Random *random_local;
  
  pvStack_20 = v;
  v_local._0_4_ = end;
  v_local._4_4_ = begin;
  _end_local = random;
  sVar5 = std::vector<int,_std::allocator<int>_>::size(v);
  local_24 = (int)sVar5;
  local_45 = -1 < v_local._4_4_ && v_local._4_4_ <= local_24;
  bVar2 = IsTrue(local_45);
  if (!bVar2) {
    GTestLog::GTestLog(&local_28,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/contrib/googletest/src/gtest-internal-inl.h"
                       ,0x13a);
    poVar6 = GTestLog::GetStream(&local_28);
    poVar6 = std::operator<<(poVar6,"Condition 0 <= begin && begin <= size failed. ");
    poVar6 = std::operator<<(poVar6,"Invalid shuffle range start ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,v_local._4_4_);
    poVar6 = std::operator<<(poVar6,": must be in range [0, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_24);
    std::operator<<(poVar6,"].");
    GTestLog::~GTestLog(&local_28);
  }
  local_79 = v_local._4_4_ <= (int)v_local && (int)v_local <= local_24;
  bVar2 = IsTrue(local_79);
  if (!bVar2) {
    GTestLog::GTestLog((GTestLog *)&last_in_range,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/contrib/googletest/src/gtest-internal-inl.h"
                       ,0x13d);
    poVar6 = GTestLog::GetStream((GTestLog *)&last_in_range);
    poVar6 = std::operator<<(poVar6,"Condition begin <= end && end <= size failed. ");
    poVar6 = std::operator<<(poVar6,"Invalid shuffle range finish ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)v_local);
    poVar6 = std::operator<<(poVar6,": must be in range [");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,v_local._4_4_);
    poVar6 = std::operator<<(poVar6,", ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_24);
    std::operator<<(poVar6,"].");
    GTestLog::~GTestLog((GTestLog *)&last_in_range);
  }
  for (selected = (int)v_local - v_local._4_4_; iVar1 = v_local._4_4_, 1 < selected;
      selected = selected + -1) {
    iVar3 = v_local._4_4_ + selected;
    UVar4 = Random::Generate(_end_local,selected);
    __a = std::vector<int,_std::allocator<int>_>::operator[](pvStack_20,(long)(int)(iVar1 + UVar4));
    __b = std::vector<int,_std::allocator<int>_>::operator[](pvStack_20,(long)(iVar3 + -1));
    std::swap<int>(__a,__b);
  }
  return;
}

Assistant:

void ShuffleRange(internal::Random* random, int begin, int end,
                  std::vector<E>* v) {
  const int size = static_cast<int>(v->size());
  GTEST_CHECK_(0 <= begin && begin <= size)
      << "Invalid shuffle range start " << begin << ": must be in range [0, "
      << size << "].";
  GTEST_CHECK_(begin <= end && end <= size)
      << "Invalid shuffle range finish " << end << ": must be in range ["
      << begin << ", " << size << "].";

  // Fisher-Yates shuffle, from
  // http://en.wikipedia.org/wiki/Fisher-Yates_shuffle
  for (int range_width = end - begin; range_width >= 2; range_width--) {
    const int last_in_range = begin + range_width - 1;
    const int selected = begin + random->Generate(range_width);
    std::swap((*v)[selected], (*v)[last_in_range]);
  }
}